

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
* __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::get_contained_functions
          (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           *__return_storage_ptr__,Dynamic_Object_Function *this)

{
  initializer_list<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> __l;
  allocator_type local_21;
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            (local_20,&(this->m_func).
                       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            );
  __l._M_len = 1;
  __l._M_array = (iterator)local_20;
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(__return_storage_ptr__,__l,&local_21);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Const_Proxy_Function> get_contained_functions() const override { return {m_func}; }